

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::Next
          (CopyingOutputStreamAdaptor *this,void **data,int *size)

{
  int iVar1;
  bool bVar2;
  uchar *puVar3;
  int iVar4;
  
  iVar4 = this->buffer_size_;
  if (this->buffer_used_ == iVar4) {
    bVar2 = WriteBuffer(this);
    if (!bVar2) {
      return false;
    }
    iVar4 = this->buffer_size_;
  }
  puVar3 = (this->buffer_).array_;
  if (puVar3 == (uchar *)0x0) {
    puVar3 = (uchar *)operator_new__((long)iVar4);
    (this->buffer_).array_ = puVar3;
  }
  iVar1 = this->buffer_used_;
  *data = puVar3 + iVar1;
  *size = iVar4 - iVar1;
  this->buffer_used_ = this->buffer_size_;
  return true;
}

Assistant:

bool CopyingOutputStreamAdaptor::Next(void** data, int* size) {
  if (buffer_used_ == buffer_size_) {
    if (!WriteBuffer()) return false;
  }

  AllocateBufferIfNeeded();

  *data = buffer_.get() + buffer_used_;
  *size = buffer_size_ - buffer_used_;
  buffer_used_ = buffer_size_;
  return true;
}